

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimCompareConst(uint *p,int nWords)

{
  ulong uVar1;
  
  if ((*p & 1) == 0) {
    if (0 < nWords) {
      uVar1 = 0;
      do {
        if (p[uVar1] != 0) {
          return 0;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)nWords != uVar1);
    }
  }
  else if (0 < nWords) {
    uVar1 = 0;
    do {
      if (p[uVar1] != 0xffffffff) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nWords != uVar1);
  }
  return 1;
}

Assistant:

int Cec_ManSimCompareConst( unsigned * p, int nWords )
{
    int w;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                return 0;
        return 1;
    }
}